

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peimage.cpp
# Opt level: O0

CBString * machineTypeToUString(CBString *__return_storage_ptr__,UINT16 machineType)

{
  UINT16 machineType_local;
  
  if (machineType == 0x14c) {
    Bstrlib::CBString::CBString(__return_storage_ptr__,"x86");
  }
  else if (machineType == 0x1c0) {
    Bstrlib::CBString::CBString(__return_storage_ptr__,"ARM");
  }
  else if (machineType == 0x1c2) {
    Bstrlib::CBString::CBString(__return_storage_ptr__,"ARM Thumb");
  }
  else if (machineType == 0x1c4) {
    Bstrlib::CBString::CBString(__return_storage_ptr__,"ARMv7");
  }
  else if (machineType == 0x1c6) {
    Bstrlib::CBString::CBString(__return_storage_ptr__,"Apple ARM");
  }
  else if (machineType == 0x1f0) {
    Bstrlib::CBString::CBString(__return_storage_ptr__,"PowerPC");
  }
  else if (machineType == 0x1f1) {
    Bstrlib::CBString::CBString(__return_storage_ptr__,"PowerPC FP");
  }
  else if (machineType == 0x200) {
    Bstrlib::CBString::CBString(__return_storage_ptr__,"IA64");
  }
  else if (machineType == 0xebc) {
    Bstrlib::CBString::CBString(__return_storage_ptr__,"EBC");
  }
  else if (machineType == 0x5032) {
    Bstrlib::CBString::CBString(__return_storage_ptr__,"RISC-V 32-bit");
  }
  else if (machineType == 0x5064) {
    Bstrlib::CBString::CBString(__return_storage_ptr__,"RISC-V 64-bit");
  }
  else if (machineType == 0x5128) {
    Bstrlib::CBString::CBString(__return_storage_ptr__,"RISC-V 128-bit");
  }
  else if (machineType == 0x8664) {
    Bstrlib::CBString::CBString(__return_storage_ptr__,"x86-64");
  }
  else if (machineType == 0xaa64) {
    Bstrlib::CBString::CBString(__return_storage_ptr__,"AArch64");
  }
  else {
    usprintf(__return_storage_ptr__,"Unknown %04Xh",(ulong)machineType);
  }
  return __return_storage_ptr__;
}

Assistant:

UString machineTypeToUString(UINT16 machineType)
{
    switch (machineType) {
        case EFI_IMAGE_FILE_MACHINE_AMD64:       return UString("x86-64");
        case EFI_IMAGE_FILE_MACHINE_ARM:         return UString("ARM");
        case EFI_IMAGE_FILE_MACHINE_ARMNT:       return UString("ARMv7");
        case EFI_IMAGE_FILE_MACHINE_APPLE_ARM:   return UString("Apple ARM");
        case EFI_IMAGE_FILE_MACHINE_AARCH64:     return UString("AArch64");
        case EFI_IMAGE_FILE_MACHINE_EBC:         return UString("EBC");
        case EFI_IMAGE_FILE_MACHINE_I386:        return UString("x86");
        case EFI_IMAGE_FILE_MACHINE_IA64:        return UString("IA64");
        case EFI_IMAGE_FILE_MACHINE_POWERPC:     return UString("PowerPC");
        case EFI_IMAGE_FILE_MACHINE_POWERPCFP:   return UString("PowerPC FP");
        case EFI_IMAGE_FILE_MACHINE_THUMB:       return UString("ARM Thumb");
        case EFI_IMAGE_FILE_MACHINE_RISCV32:     return UString("RISC-V 32-bit");
        case EFI_IMAGE_FILE_MACHINE_RISCV64:     return UString("RISC-V 64-bit");
        case EFI_IMAGE_FILE_MACHINE_RISCV128:    return UString("RISC-V 128-bit");
    }
    return usprintf("Unknown %04Xh", machineType);
}